

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O0

void __thiscall QPrinter::setOutputFileName(QPrinter *this,QString *fileName)

{
  bool bVar1;
  int iVar2;
  QPrinterPrivate *this_00;
  QString *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QPrinterPrivate *d;
  QFileInfo fi;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  uint uVar4;
  QMessageLogger *in_stack_ffffffffffffff70;
  OutputFormat format;
  undefined1 local_68 [24];
  undefined8 local_50;
  char local_48 [32];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPrinter *)0x1444f5);
  iVar2 = (*this_00->printEngine->_vptr_QPrintEngine[7])();
  if (iVar2 == 1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff70,in_RDI,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58)
    ;
    QMessageLogger::warning
              (local_48,"%s: Cannot be changed while printer is active",
               "QPrinter::setOutputFileName");
  }
  else {
    local_50 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_50,in_RSI);
    QFileInfo::suffix();
    QVar3 = Qt::Literals::StringLiterals::operator____L1
                      (in_RDI,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    iVar2 = QString::compare((QLatin1String *)local_68,(CaseSensitivity)QVar3.m_size);
    format = QVar3.m_data._4_4_;
    uVar4 = CONCAT13(iVar2 != 0,(int3)in_stack_ffffffffffffff64) ^ 0xff000000;
    QString::~QString((QString *)0x1445b1);
    if ((uVar4 & 0x1000000) == 0) {
      bVar1 = QString::isEmpty((QString *)0x1445d6);
      if (bVar1) {
        setOutputFormat((QPrinter *)this_00,format);
      }
    }
    else {
      setOutputFormat((QPrinter *)this_00,format);
    }
    QVariant::QVariant(&local_28,in_RSI);
    QPrinterPrivate::setProperty
              ((QPrinterPrivate *)CONCAT44(uVar4,in_stack_ffffffffffffff60),format,
               (QVariant *)this_00);
    QVariant::~QVariant(&local_28);
    QFileInfo::~QFileInfo((QFileInfo *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrinter::setOutputFileName(const QString &fileName)
{
    Q_D(QPrinter);
    ABORT_IF_ACTIVE("QPrinter::setOutputFileName");

    QFileInfo fi(fileName);
    if (!fi.suffix().compare("pdf"_L1, Qt::CaseInsensitive))
        setOutputFormat(QPrinter::PdfFormat);
    else if (fileName.isEmpty())
        setOutputFormat(QPrinter::NativeFormat);

    d->setProperty(QPrintEngine::PPK_OutputFileName, fileName);
}